

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestInt value)

{
  char *pcVar1;
  char **ppcVar2;
  allocator local_42;
  byte local_41;
  char **ppcStack_40;
  bool isNegative;
  char *current;
  UIntToStringBuffer buffer;
  LargestInt value_local;
  
  ppcStack_40 = (char **)(buffer + 0x11);
  local_41 = (long)this < 0;
  unique0x100000d8 = this;
  if ((bool)local_41) {
    unique0x1000004d = (Json *)-(long)this;
  }
  uintToString((LargestUInt)stack0xffffffffffffffe8,(char **)&stack0xffffffffffffffc0);
  if ((local_41 & 1) != 0) {
    pcVar1 = (char *)((long)ppcStack_40 + -1);
    ppcStack_40 = (char **)((long)ppcStack_40 + -1);
    *pcVar1 = '-';
  }
  ppcVar2 = ppcStack_40;
  if (&current <= ppcStack_40) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)ppcVar2,&local_42);
    std::allocator<char>::~allocator((allocator<char> *)&local_42);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x50,"std::string Json::valueToString(LargestInt)");
}

Assistant:

std::string valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  bool isNegative = value < 0;
  if (isNegative)
    value = -value;
  uintToString(LargestUInt(value), current);
  if (isNegative)
    *--current = '-';
  assert(current >= buffer);
  return current;
}